

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::callable>::holder<cs_impl::cni,cs::callable::types>
          (holder<cs::callable> *this,cni *args,types *args_1)

{
  types type;
  baseHolder *in_RDI;
  function_type *in_stack_ffffffffffffffb8;
  callable *in_stack_ffffffffffffffc0;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_006c2f10;
  type = (types)((ulong)(in_RDI + 1) >> 0x20);
  std::function<cs_impl::any(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&)>::
  function<cs_impl::cni,void>(&in_stack_ffffffffffffffc0->mFunc,(cni *)in_stack_ffffffffffffffb8);
  cs::callable::callable(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,type);
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
  ~function((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
            0x429ccf);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}